

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

void __thiscall QDockWidget::QDockWidget(QDockWidget *this,QWidget *parent,WindowFlags flags)

{
  QWidgetPrivate *this_00;
  
  this_00 = (QWidgetPrivate *)operator_new(0x2c8);
  QWidgetPrivate::QWidgetPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QDockWidgetPrivate_00800830;
  *(undefined4 *)&this_00->field_0x254 = 0;
  *(undefined8 *)(this_00 + 1) = 0;
  *(undefined8 *)&this_00[1].field_0x8 = 0xf00000007;
  QFont::QFont((QFont *)&this_00[1].field_0x10);
  *(undefined8 *)&this_00[1].field_0x20 = 0;
  *(undefined8 *)&this_00[1].field_0x28 = 0;
  *(undefined8 *)&this_00[1].field_0x30 = 0xffffffffffffffff;
  *(undefined8 *)&this_00[1].field_0x38 = 0;
  *(undefined8 *)&this_00[1].field_0x40 = 0;
  *(undefined8 *)&this_00[1].field_0x48 = 0;
  *(undefined8 *)&this_00[1].field_0x50 = 0;
  *(undefined8 *)&this_00[1].field_0x58 = 0;
  *(undefined8 *)&this_00[1].field_0x60 = 0;
  *(undefined8 *)&this_00[1].field_0x68 = 0;
  QWidget::QWidget(&this->super_QWidget,this_00,parent,flags);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_00800488;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QDockWidget_00800640;
  QDockWidgetPrivate::init
            (*(QDockWidgetPrivate **)&(this->super_QWidget).field_0x8,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QDockWidget::QDockWidget(QWidget *parent, Qt::WindowFlags flags)
    : QWidget(*new QDockWidgetPrivate, parent, flags)
{
    Q_D(QDockWidget);
    d->init();
}